

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool local::test_uintwide_t_edge_cases(void)

{
  bool bVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"running: test_uintwide_t_edge_cases");
  std::endl<char,std::char_traits<char>>(poVar2);
  bVar1 = math::wide_integer::test_uintwide_t_edge_cases();
  return bVar1;
}

Assistant:

auto test_uintwide_t_edge_cases() -> bool
{
  std::cout << "running: test_uintwide_t_edge_cases" << std::endl;
  #if defined(WIDE_INTEGER_NAMESPACE)
  const bool result_test_uintwide_t_edge_cases_is_ok = WIDE_INTEGER_NAMESPACE::math::wide_integer::test_uintwide_t_edge_cases();
  #else
  const bool result_test_uintwide_t_edge_cases_is_ok = ::math::wide_integer::test_uintwide_t_edge_cases();
  #endif
  return result_test_uintwide_t_edge_cases_is_ok;
}